

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O0

Vertex * Assimp::Vertex::BinaryOp<std::plus>(Vertex *__return_storage_ptr__,Vertex *v0,Vertex *v1)

{
  aiVector3D *paVar1;
  aiColor4D *paVar2;
  aiVector3t<float> aVar3;
  aiColor4t<float> aVar4;
  Vertex *res;
  undefined4 uStack_e8;
  undefined8 local_e4;
  uint local_dc;
  undefined4 uStack_d8;
  uint i_1;
  float local_d0;
  plus<aiVector3t<float>_> local_c1;
  undefined8 local_c0;
  float local_b8;
  uint local_b4;
  undefined4 uStack_b0;
  uint i;
  float local_a8;
  plus<aiVector3t<float>_> local_9d;
  undefined8 local_9c;
  float local_94;
  aiVector3t<float> local_90;
  plus<aiVector3t<float>_> local_79;
  undefined8 local_78;
  float local_70;
  aiVector3t<float> local_68;
  plus<aiVector3t<float>_> local_51;
  undefined8 local_50;
  float local_48;
  aiVector3t<float> local_40;
  plus<aiVector3t<float>_> local_29;
  undefined8 local_28;
  float local_20;
  Vertex *local_18;
  Vertex *v1_local;
  Vertex *v0_local;
  
  local_18 = v1;
  v1_local = v0;
  Vertex(__return_storage_ptr__);
  aVar3 = std::plus<aiVector3t<float>_>::operator()
                    (&local_29,&v1_local->position,&local_18->position);
  local_40.z = aVar3.z;
  local_20 = local_40.z;
  local_40._0_8_ = aVar3._0_8_;
  local_28._0_4_ = local_40.x;
  local_28._4_4_ = local_40.y;
  (__return_storage_ptr__->position).z = local_40.z;
  (__return_storage_ptr__->position).x = local_40.x;
  (__return_storage_ptr__->position).y = local_40.y;
  local_40 = aVar3;
  aVar3 = std::plus<aiVector3t<float>_>::operator()(&local_51,&v1_local->normal,&local_18->normal);
  local_68.z = aVar3.z;
  local_48 = local_68.z;
  local_68._0_8_ = aVar3._0_8_;
  local_50._0_4_ = local_68.x;
  local_50._4_4_ = local_68.y;
  (__return_storage_ptr__->normal).z = local_68.z;
  (__return_storage_ptr__->normal).x = local_68.x;
  (__return_storage_ptr__->normal).y = local_68.y;
  local_68 = aVar3;
  aVar3 = std::plus<aiVector3t<float>_>::operator()(&local_79,&v1_local->tangent,&local_18->tangent)
  ;
  local_90.z = aVar3.z;
  local_70 = local_90.z;
  local_90._0_8_ = aVar3._0_8_;
  local_78._0_4_ = local_90.x;
  local_78._4_4_ = local_90.y;
  (__return_storage_ptr__->tangent).z = local_90.z;
  (__return_storage_ptr__->tangent).x = local_90.x;
  (__return_storage_ptr__->tangent).y = local_90.y;
  local_90 = aVar3;
  aVar3 = std::plus<aiVector3t<float>_>::operator()
                    (&local_9d,&v1_local->bitangent,&local_18->bitangent);
  _uStack_b0 = aVar3._0_8_;
  local_9c = _uStack_b0;
  local_a8 = aVar3.z;
  local_94 = local_a8;
  (__return_storage_ptr__->bitangent).x = (float)uStack_b0;
  (__return_storage_ptr__->bitangent).y = (float)i;
  (__return_storage_ptr__->bitangent).z = local_a8;
  _uStack_b0 = aVar3;
  for (local_b4 = 0; local_b4 < 8; local_b4 = local_b4 + 1) {
    aVar3 = std::plus<aiVector3t<float>_>::operator()
                      (&local_c1,v1_local->texcoords + local_b4,local_18->texcoords + local_b4);
    _uStack_d8 = aVar3._0_8_;
    local_c0 = _uStack_d8;
    local_d0 = aVar3.z;
    local_b8 = local_d0;
    paVar1 = __return_storage_ptr__->texcoords + local_b4;
    paVar1->x = (float)uStack_d8;
    paVar1->y = (float)i_1;
    paVar1->z = local_d0;
    _uStack_d8 = aVar3;
  }
  for (local_dc = 0; local_dc < 8; local_dc = local_dc + 1) {
    aVar4 = std::plus<aiColor4t<float>_>::operator()
                      ((plus<aiColor4t<float>_> *)((long)&res + 3),v1_local->colors + local_dc,
                       local_18->colors + local_dc);
    paVar2 = __return_storage_ptr__->colors + local_dc;
    stack0xffffffffffffff14 = aVar4._0_8_;
    paVar2->r = (float)res._4_4_;
    paVar2->g = (float)uStack_e8;
    local_e4 = aVar4._8_8_;
    paVar2->b = (float)(undefined4)local_e4;
    paVar2->a = (float)local_e4._4_4_;
    unique0x10000359 = aVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

static Vertex BinaryOp(const Vertex& v0, const Vertex& v1) {
        // this is a heavy task for the compiler to optimize ... *pray*

        Vertex res;
        res.position  = op<aiVector3D>()(v0.position,v1.position);
        res.normal    = op<aiVector3D>()(v0.normal,v1.normal);
        res.tangent   = op<aiVector3D>()(v0.tangent,v1.tangent);
        res.bitangent = op<aiVector3D>()(v0.bitangent,v1.bitangent);

        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
            res.texcoords[i] = op<aiVector3D>()(v0.texcoords[i],v1.texcoords[i]);
        }
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
            res.colors[i] = op<aiColor4D>()(v0.colors[i],v1.colors[i]);
        }
        return res;
    }